

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,counting_iterator<char> *it)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  char cVar4;
  char *pcVar5;
  
  lVar1 = *(long *)(this + 0x10);
  pcVar5 = &it->blackhole_;
  sVar3 = it->count_;
  if (lVar1 == 0) {
    cVar4 = *pcVar5;
  }
  else {
    if (0 < lVar1) {
      lVar2 = *(long *)(this + 8);
      pcVar5 = (char *)(lVar2 + lVar1 + -1);
      sVar3 = (sVar3 - lVar2) + lVar2 + lVar1;
    }
    cVar4 = *pcVar5;
    it->count_ = sVar3;
    it->blackhole_ = cVar4;
  }
  if (*(long *)(this + 0x20) != 0) {
    cVar4 = (char)*(undefined4 *)(this + 0x18);
  }
  it->count_ = sVar3 + *(long *)(this + 0x20);
  it->blackhole_ = cVar4;
  int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

FMT_CONSTEXPR iterator begin() const { return data_; }